

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20240722::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20240722::container_internal::hash_policy_traits<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,void>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>
          *alloc_ref)

{
  ulong uVar1;
  bool bVar2;
  size_t new_capacity;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  ctrl_t *pcVar6;
  ulong uVar7;
  size_t new_i;
  size_t i;
  size_t shuffle_bit;
  slot_type *old_slots_ptr;
  slot_type *new_slots;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>
  *alloc_ref_local;
  CommonFields *c_local;
  HashSetResizeHelper *this_local;
  
  if (7 < this->old_capacity_) {
    __assert_fail("old_capacity_ < Group::kWidth / 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x82e,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>]"
                 );
  }
  sVar3 = this->old_capacity_;
  new_capacity = CommonFields::capacity(c);
  bVar2 = IsGrowingIntoSingleGroupApplicable(sVar3,new_capacity);
  if (bVar2) {
    sVar3 = CommonFields::capacity(c);
    bVar2 = is_single_group(sVar3);
    if (bVar2) {
      pvVar4 = CommonFields::slot_array(c);
      pvVar5 = old_slots(this);
      uVar1 = this->old_capacity_;
      for (new_i = 0; new_i < this->old_capacity_; new_i = new_i + 1) {
        pcVar6 = old_ctrl(this);
        bVar2 = IsFull(pcVar6[new_i]);
        if (bVar2) {
          uVar7 = new_i ^ (uVar1 >> 1) + 1;
          SanitizerUnpoisonMemoryRegion((void *)((long)pvVar4 + uVar7 * 0x30),0x30);
          common_policy_traits<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,void>
          ::
          transfer<std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                    (alloc_ref,(slot_type *)((long)pvVar4 + uVar7 * 0x30),
                     (slot_type *)((long)pvVar5 + new_i * 0x30));
        }
      }
      PoisonSingleGroupEmptySlots(this,c,0x30);
      return;
    }
    __assert_fail("is_single_group(c.capacity())",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x831,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>]"
                 );
  }
  __assert_fail("IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x82f,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    assert(old_capacity_ < Group::kWidth / 2);
    assert(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    assert(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array());
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());

    size_t shuffle_bit = old_capacity_ / 2 + 1;
    for (size_t i = 0; i < old_capacity_; ++i) {
      if (IsFull(old_ctrl()[i])) {
        size_t new_i = i ^ shuffle_bit;
        SanitizerUnpoisonMemoryRegion(new_slots + new_i, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots + new_i,
                               old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }